

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

int __thiscall Catch::Session::run(Session *this)

{
  Config *config;
  size_t sVar1;
  size_t sVar2;
  Totals local_40;
  
  if ((this->m_configData).showHelp != false) {
    return 0;
  }
  Session::config(this);
  seedRng((IConfig *)(this->m_config).m_p);
  if ((this->m_configData).filenamesAsTags == true) {
    applyFilenamesAsTags((IConfig *)(this->m_config).m_p);
  }
  config = Session::config(this);
  local_40.assertions.passed = 0;
  if ((config->m_data).listTests == true) {
    sVar1 = listTests(config);
    local_40.assertions.passed = (size_t)&local_40.assertions.failed;
    local_40.assertions.failed = sVar1;
    if ((config->m_data).listTestNamesOnly != false) {
LAB_00122fbe:
      sVar2 = listTestsNamesOnly(config);
      sVar1 = sVar1 + sVar2;
    }
    local_40.assertions.passed = (size_t)&local_40.assertions.failed;
    local_40.assertions.failed = sVar1;
    if ((config->m_data).listTags != false) {
LAB_00122fe6:
      sVar2 = listTags(config);
      local_40.assertions.failed = sVar1 + sVar2;
    }
    local_40.assertions.passed = (size_t)&local_40.assertions.failed;
    sVar1 = local_40.assertions.failed;
    if ((config->m_data).listReporters == false) goto LAB_00123013;
  }
  else {
    if ((config->m_data).listTestNamesOnly == true) {
      sVar1 = 0;
      goto LAB_00122fbe;
    }
    if ((config->m_data).listTags == true) {
      sVar1 = 0;
      goto LAB_00122fe6;
    }
    if ((config->m_data).listReporters != true) {
      runTests(&local_40,&this->m_config);
      goto LAB_00123013;
    }
    sVar1 = 0;
  }
  local_40.assertions.failed = listReporters(config);
  local_40.assertions.failed = local_40.assertions.failed + sVar1;
LAB_00123013:
  return (int)local_40.assertions.failed;
}

Assistant:

int run() {
            if( m_configData.showHelp )
                return 0;

            try
            {
                config(); // Force config to be constructed

                seedRng( *m_config );

                if( m_configData.filenamesAsTags )
                    applyFilenamesAsTags( *m_config );

                // Handle list request
                if( Option<std::size_t> listed = list( config() ) )
                    return static_cast<int>( *listed );

                return static_cast<int>( runTests( m_config ).assertions.failed );
            }
            catch( std::exception& ex ) {
                Catch::cerr() << ex.what() << std::endl;
                return (std::numeric_limits<int>::max)();
            }
        }